

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NetworkUpdateParameters::InternalSwap
          (NetworkUpdateParameters *this,NetworkUpdateParameters *other)

{
  int iVar1;
  Optimizer *pOVar2;
  Int64Parameter *pIVar3;
  BoolParameter *pBVar4;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->losslayers_).super_RepeatedPtrFieldBase,
             &(other->losslayers_).super_RepeatedPtrFieldBase);
  pOVar2 = this->optimizer_;
  this->optimizer_ = other->optimizer_;
  other->optimizer_ = pOVar2;
  pIVar3 = this->epochs_;
  this->epochs_ = other->epochs_;
  other->epochs_ = pIVar3;
  pBVar4 = this->shuffle_;
  this->shuffle_ = other->shuffle_;
  other->shuffle_ = pBVar4;
  pIVar3 = this->seed_;
  this->seed_ = other->seed_;
  other->seed_ = pIVar3;
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void NetworkUpdateParameters::InternalSwap(NetworkUpdateParameters* other) {
  losslayers_.InternalSwap(&other->losslayers_);
  std::swap(optimizer_, other->optimizer_);
  std::swap(epochs_, other->epochs_);
  std::swap(shuffle_, other->shuffle_);
  std::swap(seed_, other->seed_);
  std::swap(_cached_size_, other->_cached_size_);
}